

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Float __thiscall pbrt::FloatMixTexture::Evaluate(FloatMixTexture *this,TextureEvalContext ctx)

{
  Float FVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [4];
  undefined1 extraout_var [60];
  
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[2].z = ctx.dvdy;
  aTStack_40[3].x = (float)ctx.faceIndex;
  FVar1 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
          ::
          Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                      *)&this->amount,(TextureEvalContext *)local_58);
  auVar3 = ZEXT816(0) << 0x40;
  if ((FVar1 != 1.0) || (NAN(FVar1))) {
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    auVar4._0_4_ = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                   ::
                   Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                               *)this,(TextureEvalContext *)local_58);
    auVar4._4_60_ = extraout_var;
    auVar3 = auVar4._0_16_;
  }
  fVar2 = 0.0;
  if ((FVar1 != 0.0) || (NAN(FVar1))) {
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    fVar2 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
            ::
            Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                        *)&this->tex2,(TextureEvalContext *)local_58);
    auVar3 = ZEXT416(auVar3._0_4_);
  }
  auVar3 = vfmadd213ss_fma(auVar3,ZEXT416((uint)(1.0 - FVar1)),ZEXT416((uint)(FVar1 * fVar2)));
  return auVar3._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Float amt = amount.Evaluate(ctx);
        Float t1 = 0, t2 = 0;
        if (amt != 1)
            t1 = tex1.Evaluate(ctx);
        if (amt != 0)
            t2 = tex2.Evaluate(ctx);
        return (1 - amt) * t1 + amt * t2;
    }